

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

bool __thiscall QPDFFormFieldObjectHelper::isPushbutton(QPDFFormFieldObjectHelper *this)

{
  bool bVar1;
  int iVar2;
  string local_30;
  
  getFieldType_abi_cxx11_(&local_30,this);
  bVar1 = std::operator==(&local_30,"/Btn");
  if (bVar1) {
    iVar2 = getFlags(this);
    bVar1 = (bool)((byte)((uint)iVar2 >> 0x10) & 1);
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool
QPDFFormFieldObjectHelper::isPushbutton()
{
    return ((getFieldType() == "/Btn") && ((getFlags() & ff_btn_pushbutton) == ff_btn_pushbutton));
}